

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O2

void __thiscall ktxApp::processOptions(ktxApp *this,argparser *parser)

{
  uint uVar1;
  int iVar2;
  
  while( true ) {
    do {
      do {
        uVar1 = argparser::getopt(parser,(int)this + 0x58,
                                  &((this->option_list).
                                    super__Vector_base<argparser::option,_std::allocator<argparser::option>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->name,(char *)0x0);
      } while (uVar1 == 0);
    } while (uVar1 == 10000);
    if (uVar1 == 0xffffffff) {
      return;
    }
    if (uVar1 == 0x3a) break;
    if (uVar1 == 0x76) {
      printVersion(this);
      goto LAB_00106898;
    }
    if (uVar1 == 0x68) goto LAB_00106885;
    iVar2 = (*this->_vptr_ktxApp[3])(this,parser,(ulong)uVar1);
    if ((char)iVar2 == '\0') {
      (*this->_vptr_ktxApp[1])(this);
      exit(1);
    }
  }
  error(this,"missing required option argument.");
LAB_00106885:
  (*this->_vptr_ktxApp[1])();
LAB_00106898:
  exit(0);
}

Assistant:

virtual void processOptions(argparser& parser) {
        int opt;
        while ((opt = parser.getopt(&short_opts, option_list.data(), NULL)) != -1) {
            switch (opt) {
              case 0:
                break;
              case 10000:
                break;
              case 'h':
                usage();
                exit(0);
              case 'v':
                printVersion();
                exit(0);
              case ':':
                error("missing required option argument.");
                usage();
                exit(0);
              default:
                if (!processOption(parser, opt)) {
                    usage();
                    exit(1);
                }
            }
        }
#if defined(_WIN32) && defined(DEBUG)
        if (options.launchDebugger)
            launchDebugger();
#endif
    }